

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

string * polyscope::typeName_abi_cxx11_(ManagedBufferType type)

{
  undefined4 in_ESI;
  string *in_RDI;
  string *in_stack_ffffffffffffff80;
  allocator *paVar1;
  allocator local_4a;
  allocator local_49;
  string local_48 [32];
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Float",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Double",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    paVar1 = &local_1e;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Vec2",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Vec3",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Vec4",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Arr2Vec3",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Arr3Vec3",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Arr4Vec3",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UInt32",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"Int32",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UVec2",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UVec3",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"UVec4",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"bad enum",&local_49);
    exception(in_stack_ffffffffffffff80);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,(char *)0x0,&local_4a);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a);
  }
  return in_RDI;
}

Assistant:

std::string typeName(ManagedBufferType type) {
  switch (type) {
  // clang-format off
    case ManagedBufferType::Float     : return "Float";    
    case ManagedBufferType::Double    : return "Double";   
    case ManagedBufferType::Vec2      : return "Vec2";     
    case ManagedBufferType::Vec3      : return "Vec3";     
    case ManagedBufferType::Vec4      : return "Vec4";     
    case ManagedBufferType::Arr2Vec3  : return "Arr2Vec3"; 
    case ManagedBufferType::Arr3Vec3  : return "Arr3Vec3"; 
    case ManagedBufferType::Arr4Vec3  : return "Arr4Vec3"; 
    case ManagedBufferType::UInt32    : return "UInt32";   
    case ManagedBufferType::Int32     : return "Int32";    
    case ManagedBufferType::UVec2     : return "UVec2";    
    case ManagedBufferType::UVec3     : return "UVec3";    
    case ManagedBufferType::UVec4     : return "UVec4";
    // clang-format on
  }
  exception("bad enum");
  return 0;
}